

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_GetDropItems
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  long lVar3;
  int iVar4;
  char *__assertion;
  undefined8 *puVar5;
  bool bVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00432c93;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar5 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar5 != (undefined8 *)0x0) {
        pPVar2 = (PClass *)puVar5[1];
        if (pPVar2 == (PClass *)0x0) {
          pPVar2 = (PClass *)(**(code **)*puVar5)(puVar5);
          puVar5[1] = pPVar2;
        }
        bVar6 = pPVar2 == (PClass *)0x0;
        bVar7 = !bVar6;
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar2 == pPVar1 || bVar6);
        if (pPVar2 != pPVar1 && !bVar6) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar7 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar1) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00432c93;
        }
        goto LAB_00432c3b;
      }
    }
    else if (puVar5 != (undefined8 *)0x0) goto LAB_00432c83;
    puVar5 = (undefined8 *)0x0;
LAB_00432c3b:
    lVar3 = puVar5[1];
    if (lVar3 == 0) {
      lVar3 = (**(code **)*puVar5)(puVar5,defaultparam);
      puVar5[1] = lVar3;
    }
    if (numret < 1) {
      iVar4 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1c97,
                      "int AF_AActor_GetDropItems(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar4 = 1;
      VMReturn::SetPointer(ret,*(void **)(lVar3 + 0x1b8),1);
    }
    return iVar4;
  }
LAB_00432c83:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00432c93:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1c96,
                "int AF_AActor_GetDropItems(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDropItems)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_OBJECT(self->GetDropItems());
}